

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsData.cpp
# Opt level: O3

int32_t helicsDataBufferFillFromComplexVector(HelicsDataBuffer data,double *value,int dataSize)

{
  Message *pMVar1;
  SmallBuffer *ptr;
  ulong size;
  
  if ((data == (HelicsDataBuffer)0x0) || (*(int *)((long)data + 0x5c) != 0x24ea663f)) {
    pMVar1 = getMessageObj(data,(HelicsError *)0x0);
    if (pMVar1 == (Message *)0x0) {
      return 0;
    }
    data = &pMVar1->data;
  }
  size = (long)dataSize << 4 | 8;
  helics::SmallBuffer::reserve((SmallBuffer *)data,size);
  ((SmallBuffer *)data)->bufferSize = size;
  helics::detail::convertToBinary
            (((SmallBuffer *)data)->heap,(complex<double> *)value,(long)dataSize);
  return (int32_t)((SmallBuffer *)data)->bufferSize;
}

Assistant:

int32_t helicsDataBufferFillFromComplexVector(HelicsDataBuffer data, const double* value, int dataSize)
{
    auto* ptr = getBuffer(data);
    if (ptr == nullptr) {
        return 0;
    }
    try {
        helics::ValueConverter<std::complex<double>>::convert(reinterpret_cast<const std::complex<double>*>(value), dataSize, *ptr);
        return static_cast<int32_t>(ptr->size());
    }
    catch (const std::bad_alloc&) {
        return 0;
    }
}